

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *compilation,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,
          ASTContext *context,uint32_t constructIndex)

{
  bitmask<slang::ast::VariableFlags> *this;
  StatementBlockSymbol *this_00;
  bool bVar1;
  int iVar2;
  MemberSyntax *pMVar3;
  GenerateBlockArraySymbol *this_01;
  Scope *pSVar4;
  CompilationOptions *pCVar5;
  Diagnostic *pDVar6;
  Type *pTVar7;
  ExpressionSyntax *pEVar8;
  SourceLocation location;
  Expression *pEVar9;
  VariableSymbol *pVVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantValue *this_02;
  SVInt *pSVar11;
  undefined4 extraout_var_01;
  iterator ppGVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  LookupLocation LVar13;
  SourceRange SVar14;
  string_view arg;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar15;
  LookupLocation lookupLocation;
  GenerateBlockSymbol *entry;
  iterator __end3_1;
  iterator __begin3_1;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *__range3_1;
  ConstantValue local_800;
  span<const_slang::ast::GenerateBlockSymbol_*,_18446744073709551615UL> local_7d8;
  span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL> local_7c8;
  ConstantValue local_7b8;
  iterator local_790;
  SVInt *index;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::SVInt,_8UL> *__range3;
  SourceRange local_748;
  DiagCode local_734;
  ConstantValue local_730;
  SourceRange local_708;
  DiagCode local_6f4;
  EntryPointer local_6f0;
  undefined1 local_6e8;
  EntryPointer local_6e0;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pair;
  ConstantValue stop;
  undefined1 local_690 [8];
  SmallVector<slang::SVInt,_8UL> indices;
  SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  usedValues;
  uint64_t loopCount;
  ConstantValue local_4e8;
  ConstantValue *local_4c0;
  ConstantValue *loopVal;
  undefined1 local_4b0 [8];
  EvalContext evalContext;
  Expression *iterExpr;
  Expression *local_278;
  Expression *stopExpr;
  undefined8 local_268;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [8];
  ASTContext iterContext;
  SourceLocation local_218;
  string_view local_210;
  VariableSymbol *local_200;
  VariableSymbol *local;
  StatementBlockSymbol *local_1f0;
  StatementBlockSymbol *iterScope;
  undefined1 local_1e0 [8];
  ConstantValue initialVal;
  Expression *initial;
  anon_class_40_5_68e605a5 createBlock;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  Diagnostic *diag;
  SourceRange local_e0;
  Scope *local_d0;
  uint32_t local_c8;
  Scope *local_c0;
  uint32_t local_b8;
  string_view local_b0;
  Symbol *local_a0;
  Symbol *symbol;
  uint64_t loopLimit;
  uint64_t baseCount;
  Token genvar;
  GenerateBlockArraySymbol *result;
  undefined1 local_50 [8];
  SourceLocation loc;
  string_view name;
  uint32_t constructIndex_local;
  ASTContext *context_local;
  SymbolIndex scopeIndex_local;
  LoopGenerateSyntax *syntax_local;
  Compilation *compilation_local;
  
  name._M_str._4_4_ = constructIndex;
  pMVar3 = not_null<slang::syntax::MemberSyntax_*>::operator*(&syntax->block);
  _loc = getGenerateBlockName(&pMVar3->super_SyntaxNode);
  pMVar3 = not_null<slang::syntax::MemberSyntax_*>::operator->(&syntax->block);
  _result = slang::syntax::SyntaxNode::getFirstToken(&pMVar3->super_SyntaxNode);
  local_50 = (undefined1  [8])parsing::Token::location((Token *)&result);
  this_01 = BumpAllocator::
            emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                      (&compilation->super_BumpAllocator,compilation,
                       (basic_string_view<char,_std::char_traits<char>_> *)&loc,
                       (SourceLocation *)local_50,(uint *)((long)&name._M_str + 4));
  Symbol::setSyntax(&this_01->super_Symbol,(SyntaxNode *)syntax);
  pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
  join_0x00000010_0x00000000_ =
       slang::syntax::SyntaxList::operator_cast_to_span
                 ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this_01->super_Symbol,pSVar4,join_0x00000010_0x00000000_);
  baseCount._0_2_ = (syntax->identifier).kind;
  baseCount._2_1_ = (syntax->identifier).field_0x2;
  baseCount._3_1_ = (syntax->identifier).numFlags;
  baseCount._4_4_ = (syntax->identifier).rawLen;
  genvar._0_8_ = (syntax->identifier).info;
  bVar1 = parsing::Token::isMissing((Token *)&baseCount);
  if (bVar1) {
    return this_01;
  }
  pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
  loopLimit = getGenerateLoopCount(pSVar4);
  pCVar5 = Compilation::getOptions(compilation);
  symbol = (Symbol *)(ulong)pCVar5->maxGenerateSteps;
  bVar1 = parsing::Token::operator_cast_to_bool(&syntax->genvar);
  if (!bVar1) {
    pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
    local_b0 = parsing::Token::valueText((Token *)&baseCount);
    LVar13 = ASTContext::getLocation(context);
    local_d0 = LVar13.scope;
    local_c8 = LVar13.index;
    local_c0 = local_d0;
    local_b8 = local_c8;
    local_e0 = parsing::Token::range((Token *)&baseCount);
    bitmask<slang::ast::LookupFlags>::bitmask
              ((bitmask<slang::ast::LookupFlags> *)((long)&diag + 4),None);
    LVar13.index = local_b8;
    LVar13.scope = local_c0;
    LVar13._12_4_ = 0;
    local_a0 = Lookup::unqualifiedAt(pSVar4,local_b0,LVar13,local_e0,diag._4_4_);
    if (local_a0 == (Symbol *)0x0) {
      return this_01;
    }
    if (local_a0->kind != Genvar) {
      SVar14 = parsing::Token::range((Token *)&baseCount);
      pDVar6 = ASTContext::addDiag(context,(DiagCode)0x1a000a,SVar14);
      arg = parsing::Token::valueText((Token *)&baseCount);
      Diagnostic::operator<<(pDVar6,arg);
      Diagnostic::addNote(pDVar6,(DiagCode)0x40001,local_a0->location);
      return this_01;
    }
  }
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *)&createBlock.entries);
  createBlock.compilation = (Compilation *)local_50;
  createBlock.loc = (SourceLocation *)&baseCount;
  initial = (Expression *)compilation;
  createBlock.genvar = (Token *)syntax;
  createBlock.syntax = (LoopGenerateSyntax *)&createBlock.entries;
  pTVar7 = Compilation::getIntegerType(compilation);
  pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->initialExpr);
  location = parsing::Token::location(&syntax->equals);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)
             ((long)&initialVal.value.
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             + 0x20),None);
  pEVar9 = Expression::bindRValue
                     (pTVar7,pEVar8,location,context,
                      (bitmask<slang::ast::ASTFlags>)
                      initialVal.value.
                      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      ._32_8_);
  iterScope._7_1_ = '\0';
  bitmask<slang::ast::EvalFlags>::bitmask((bitmask<slang::ast::EvalFlags> *)((long)&iterScope + 7));
  ASTContext::eval((ConstantValue *)local_1e0,context,pEVar9,iterScope._7_1_);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)local_1e0);
  if (bVar1) {
    local._4_4_ = 0;
    local._0_4_ = 0;
    local_1f0 = BumpAllocator::
                emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                          (&compilation->super_BumpAllocator,compilation,(char (*) [1])0x6e02a2,
                           (SourceLocation *)local_50,(StatementBlockKind *)((long)&local + 4),
                           (VariableLifetime *)&local);
    local_210 = parsing::Token::valueText((Token *)&baseCount);
    local_218 = parsing::Token::location((Token *)&baseCount);
    iterContext.assertionInstance._4_4_ = 0;
    pVVar10 = BumpAllocator::
              emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                        (&compilation->super_BumpAllocator,&local_210,&local_218,
                         (VariableLifetime *)((long)&iterContext.assertionInstance + 4));
    local_200 = pVVar10;
    pTVar7 = Compilation::getIntegerType(compilation);
    ValueSymbol::setType(&pVVar10->super_ValueSymbol,pTVar7);
    this = (bitmask<slang::ast::VariableFlags> *)((long)&iterContext.assertionInstance + 2);
    bitmask<slang::ast::VariableFlags>::bitmask(this,CompilerGenerated);
    bitmask<slang::ast::VariableFlags>::operator|=(&local_200->flags,this);
    this_00 = local_1f0;
    pSVar4 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
    StatementBlockSymbol::setTemporaryParent(this_00,pSVar4,scopeIndex);
    Scope::addMember(&local_1f0->super_Scope,(Symbol *)local_200);
    pSVar4 = &local_1f0->super_Scope;
    local_268 = LookupLocation::max;
    uStack_260 = (undefined4)DAT_0091b918;
    uStack_25c = (undefined4)((ulong)DAT_0091b918 >> 0x20);
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&stopExpr,None);
    lookupLocation.index = uStack_260;
    lookupLocation.scope = (Scope *)local_268;
    lookupLocation._12_4_ = 0;
    ASTContext::ASTContext
              ((ASTContext *)local_258,pSVar4,lookupLocation,(bitmask<slang::ast::ASTFlags>)stopExpr
              );
    pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->stopExpr);
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&iterExpr,None);
    iVar2 = Expression::bind((int)pEVar8,(sockaddr *)local_258,(socklen_t)iterExpr);
    local_278 = (Expression *)CONCAT44(extraout_var,iVar2);
    pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->iterationExpr);
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&evalContext.disableRange.endLoc,AssignmentAllowed);
    iVar2 = Expression::bind((int)pEVar8,(sockaddr *)local_258,evalContext.disableRange.endLoc._0_4_
                            );
    pEVar9 = (Expression *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = Expression::bad(local_278);
    if (!bVar1) {
      bVar1 = Expression::bad(pEVar9);
      if (!bVar1) {
        bVar1 = ASTContext::requireBooleanConvertible(context,local_278);
        if (bVar1) {
          loopVal._7_1_ = '\0';
          bitmask<slang::ast::EvalFlags>::bitmask
                    ((bitmask<slang::ast::EvalFlags> *)((long)&loopVal + 7));
          EvalContext::EvalContext((EvalContext *)local_4b0,compilation,loopVal._7_1_);
          EvalContext::pushEmptyFrame((EvalContext *)local_4b0);
          pVVar10 = local_200;
          slang::ConstantValue::ConstantValue(&local_4e8,(ConstantValue *)local_1e0);
          this_02 = EvalContext::createLocal
                              ((EvalContext *)local_4b0,&pVVar10->super_ValueSymbol,&local_4e8);
          slang::ConstantValue::~ConstantValue(&local_4e8);
          local_4c0 = this_02;
          pSVar11 = slang::ConstantValue::integer(this_02);
          bVar1 = SVInt::hasUnknown(pSVar11);
          if (bVar1) {
            SVar14 = parsing::Token::range((Token *)&baseCount);
            pDVar6 = ASTContext::addDiag((ASTContext *)local_258,(DiagCode)0x280006,SVar14);
            Diagnostic::operator<<(pDVar6,local_4c0);
          }
          usedValues.
          super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          .
          super_sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          .num_elements = 0;
          SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          ::SmallSet((SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                      *)(indices.stackBase + 0x68));
          SmallVector<slang::SVInt,_8UL>::SmallVector((SmallVector<slang::SVInt,_8UL> *)local_690);
          do {
            usedValues.
            super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
            .
            super_sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
            .num_elements =
                 loopLimit +
                 usedValues.
                 super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                 .
                 super_sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                 .num_elements;
            if (symbol < usedValues.
                         super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                         .
                         super_sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                         .num_elements) {
              SVar14 = parsing::Token::range(&syntax->keyword);
              ASTContext::addDiag(context,(DiagCode)0x500006,SVar14);
              goto LAB_002b0c78;
            }
            Expression::eval((ConstantValue *)&pair.second,local_278,(EvalContext *)local_4b0);
            bVar1 = slang::ConstantValue::bad((ConstantValue *)&pair.second);
            if (bVar1) {
LAB_002b0684:
              bVar1 = slang::ConstantValue::bad((ConstantValue *)&pair.second);
              this_01->valid = (bool)((bVar1 ^ 0xffU) & 1);
              iterScope._0_4_ = 3;
            }
            else {
              bVar1 = slang::ConstantValue::isTrue((ConstantValue *)&pair.second);
              if (!bVar1) goto LAB_002b0684;
              pSVar11 = slang::ConstantValue::integer(local_4c0);
              SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
                        ((SmallVectorBase<slang::SVInt> *)local_690,pSVar11);
              pSVar11 = slang::ConstantValue::integer(local_4c0);
              pVar15 = ska::
                       flat_hash_set<slang::SVInt,_std::hash<slang::SVInt>,_std::equal_to<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                       ::emplace((flat_hash_set<slang::SVInt,_std::hash<slang::SVInt>,_std::equal_to<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                                  *)&usedValues.
                                     super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>
                                     .ptr,pSVar11);
              local_6f0 = (EntryPointer)pVar15.first.current;
              local_6e8 = pVar15.second;
              local_6e0 = local_6f0;
              pair.first.current._0_1_ = local_6e8;
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                local_6f4.subsystem = Declarations;
                local_6f4.code = 0x27;
                SVar14 = parsing::Token::range((Token *)&baseCount);
                local_708 = SVar14;
                pDVar6 = ASTContext::addDiag((ASTContext *)local_258,local_6f4,SVar14);
                Diagnostic::operator<<(pDVar6,local_4c0);
                iterScope._0_4_ = 3;
              }
              else {
                Expression::eval(&local_730,pEVar9,(EvalContext *)local_4b0);
                bVar1 = slang::ConstantValue::operator_cast_to_bool(&local_730);
                slang::ConstantValue::~ConstantValue(&local_730);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pSVar11 = slang::ConstantValue::integer(local_4c0);
                  bVar1 = SVInt::hasUnknown(pSVar11);
                  if (bVar1) {
                    local_734.subsystem = Declarations;
                    local_734.code = 0x28;
                    SVar14 = parsing::Token::range((Token *)&baseCount);
                    local_748 = SVar14;
                    pDVar6 = ASTContext::addDiag((ASTContext *)local_258,local_734,SVar14);
                    Diagnostic::operator<<(pDVar6,local_4c0);
                    iterScope._0_4_ = 3;
                  }
                  else {
                    iterScope._0_4_ = 0;
                  }
                }
                else {
                  iterScope._0_4_ = 3;
                }
              }
            }
            slang::ConstantValue::~ConstantValue((ConstantValue *)&pair.second);
          } while ((int)iterScope == 0);
          bVar1 = SmallVectorBase<slang::SVInt>::empty((SmallVectorBase<slang::SVInt> *)local_690);
          if (bVar1) {
            Expression::eval((ConstantValue *)&__range3,pEVar9,(EvalContext *)local_4b0);
            slang::ConstantValue::~ConstantValue((ConstantValue *)&__range3);
          }
          EvalContext::reportDiags((EvalContext *)local_4b0,(ASTContext *)local_258);
          src = extraout_RDX;
          if ((this_01->valid & 1U) != 0) {
            __begin3 = (iterator)local_690;
            __end3 = SmallVectorBase<slang::SVInt>::begin((SmallVectorBase<slang::SVInt> *)__begin3)
            ;
            index = SmallVectorBase<slang::SVInt>::end((SmallVectorBase<slang::SVInt> *)__begin3);
            src = extraout_RDX_00;
            for (; __end3 != index; __end3 = __end3 + 1) {
              local_790 = __end3;
              slang::ConstantValue::ConstantValue(&local_7b8,__end3);
              fromSyntax::anon_class_40_5_68e605a5::operator()
                        ((anon_class_40_5_68e605a5 *)&initial,&local_7b8,true);
              slang::ConstantValue::~ConstantValue(&local_7b8);
              src = extraout_RDX_01;
            }
          }
          iVar2 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                            ((SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *)
                             &createBlock.entries,(EVP_PKEY_CTX *)compilation,src);
          local_7d8.data_ = (pointer)CONCAT44(extraout_var_01,iVar2);
          nonstd::span_lite::
          span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>::
          span<const_slang::ast::GenerateBlockSymbol_*,_18446744073709551615UL,_0>
                    (&local_7c8,&local_7d8);
          (this_01->entries).data_ = local_7c8.data_;
          (this_01->entries).size_ = local_7c8.size_;
          bVar1 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::empty
                            ((SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *)
                             &createBlock.entries);
          if (bVar1) {
            SVInt::SVInt((SVInt *)&__range3_1,0x20,0,true);
            slang::ConstantValue::ConstantValue(&local_800,(SVInt *)&__range3_1);
            fromSyntax::anon_class_40_5_68e605a5::operator()
                      ((anon_class_40_5_68e605a5 *)&initial,&local_800,false);
            slang::ConstantValue::~ConstantValue(&local_800);
            SVInt::~SVInt((SVInt *)&__range3_1);
          }
          else {
            __end3_1 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::begin
                                 ((SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *)
                                  &createBlock.entries);
            ppGVar12 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::end
                                 ((SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *)
                                  &createBlock.entries);
            for (; __end3_1 != ppGVar12; __end3_1 = __end3_1 + 1) {
              Scope::addMember(&this_01->super_Scope,&(*__end3_1)->super_Symbol);
            }
          }
LAB_002b0c78:
          iterScope._0_4_ = 1;
          SmallVector<slang::SVInt,_8UL>::~SmallVector((SmallVector<slang::SVInt,_8UL> *)local_690);
          SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          ::~SmallSet((SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                       *)(indices.stackBase + 0x68));
          EvalContext::~EvalContext((EvalContext *)local_4b0);
        }
        else {
          iterScope._0_4_ = 1;
        }
        goto LAB_002b0cc4;
      }
    }
    iterScope._0_4_ = 1;
  }
  else {
    iterScope._0_4_ = 1;
  }
LAB_002b0cc4:
  slang::ConstantValue::~ConstantValue((ConstantValue *)local_1e0);
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> *)&createBlock.entries);
  return this_01;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& compilation,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    string_view name = getGenerateBlockName(*syntax.block);
    SourceLocation loc = syntax.block->getFirstToken().location();
    auto result = compilation.emplace<GenerateBlockArraySymbol>(compilation, name, loc,
                                                                constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = compilation.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&](ConstantValue value, bool isInstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = compilation.emplace<GenerateBlockSymbol>(compilation, "", loc, 1u,
                                                              isInstantiated);
        auto implicitParam = compilation.emplace<ParameterSymbol>(
            genvar.valueText(), genvar.location(), true /* isLocal */, false /* isPort */);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        if (isInstantiated)
            addBlockMembers(*block, *syntax.block);

        implicitParam->setType(compilation.getIntegerType());
        implicitParam->setValue(compilation, std::move(value), /* needsCoercion */ false);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(compilation.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.location(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *compilation.emplace<StatementBlockSymbol>(compilation, "", loc,
                                                                 StatementBlockKind::Sequential,
                                                                 VariableLifetime::Automatic);
    auto& local = *compilation.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                       VariableLifetime::Automatic);
    local.setType(compilation.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(compilation);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportDiags(iterContext);

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        for (auto& index : indices)
            createBlock(index, true);
    }

    result->entries = entries.copy(compilation);
    if (entries.empty())
        createBlock(SVInt(32, 0, true), false);
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}